

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::WriteParamTypes(CWriter *this,FuncDeclaration *decl)

{
  ulong uVar1;
  
  if ((((long)(decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 0) &&
     (((long)(decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 0)) {
    uVar1 = 0;
    do {
      WriteData(this,", ",2);
      Write(this,(decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < ((ulong)((long)(decl->sig).param_types.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(decl->sig).param_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff));
  }
  return;
}

Assistant:

void CWriter::WriteParamTypes(const FuncDeclaration& decl) {
  if (decl.GetNumParams() != 0) {
    for (Index i = 0; i < decl.GetNumParams(); ++i) {
      Write(", ");
      Write(decl.GetParamType(i));
    }
  }
}